

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O2

void recff_string_char(jit_State *J,RecordFFData *rd)

{
  TRef TVar1;
  TRef TVar2;
  uint uVar3;
  TRef TVar4;
  TRef *pTVar5;
  ulong uVar6;
  
  TVar2 = lj_ir_kint(J,0xff);
  pTVar5 = J->base;
  uVar3 = 0;
  while( true ) {
    uVar6 = (ulong)uVar3;
    if (pTVar5[uVar6] == 0) break;
    TVar4 = lj_opt_narrow_toint(J,pTVar5[uVar6]);
    (J->fold).ins.field_0.ot = 0x693;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar4;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar2;
    lj_opt_fold(J);
    (J->fold).ins.field_0.op1 = (IRRef1)TVar4;
    *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x5b040002;
    TVar4 = lj_opt_fold(J);
    pTVar5 = J->base;
    pTVar5[uVar6] = TVar4;
    uVar3 = uVar3 + 1;
  }
  if (uVar3 < 2) {
    if (uVar6 != 0) {
      return;
    }
    TVar2 = lj_ir_kgc(J,(GCobj *)(J[-1].penalty + 0x3a),IRT_STR);
  }
  else {
    TVar4 = recff_bufhdr(J);
    uVar6 = 0;
    TVar2 = TVar4;
    while( true ) {
      TVar1 = J->base[uVar6];
      if (TVar1 == 0) break;
      (J->fold).ins.field_0.ot = 0x5405;
      (J->fold).ins.field_0.op1 = (IRRef1)TVar2;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar1;
      TVar2 = lj_opt_fold(J);
      uVar6 = (ulong)((int)uVar6 + 1);
    }
    (J->fold).ins.field_0.ot = 0x5504;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar2;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar4;
    TVar2 = lj_opt_fold(J);
  }
  *J->base = TVar2;
  return;
}

Assistant:

static void LJ_FASTCALL recff_string_char(jit_State *J, RecordFFData *rd)
{
  TRef k255 = lj_ir_kint(J, 255);
  BCReg i;
  for (i = 0; J->base[i] != 0; i++) {  /* Convert char values to strings. */
    TRef tr = lj_opt_narrow_toint(J, J->base[i]);
    emitir(IRTGI(IR_ULE), tr, k255);
    J->base[i] = emitir(IRT(IR_TOSTR, IRT_STR), tr, IRTOSTR_CHAR);
  }
  if (i > 1) {  /* Concatenate the strings, if there's more than one. */
    TRef hdr = recff_bufhdr(J), tr = hdr;
    for (i = 0; J->base[i] != 0; i++)
      tr = emitir(IRT(IR_BUFPUT, IRT_PGC), tr, J->base[i]);
    J->base[0] = emitir(IRT(IR_BUFSTR, IRT_STR), tr, hdr);
  } else if (i == 0) {
    J->base[0] = lj_ir_kstr(J, &J2G(J)->strempty);
  }
  UNUSED(rd);
}